

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteVerilog(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
      fprintf((FILE *)pAbc->Out,"Empty network.\n");
      return 0;
    }
    if (argc == globalUtilOptind + 1) {
      Io_Write(pAbc->pNtkCur,argv[globalUtilOptind],IO_FILE_VERILOG);
      return 0;
    }
  }
  fprintf((FILE *)pAbc->Err,"usage: write_verilog [-h] <file>\n");
  fprintf((FILE *)pAbc->Err,"\t         writes the current network in Verilog format\n");
  fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
  fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
  return 1;
}

Assistant:

int IoCommandWriteVerilog( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_VERILOG );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_verilog [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the current network in Verilog format\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}